

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxCollision.h
# Opt level: O2

void __thiscall cbtAABB::appy_transform(cbtAABB *this,cbtTransform *trans)

{
  cbtAABB cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar12 [32];
  undefined1 auVar18 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  cbtVector3 cVar21;
  cbtVector3 cVar22;
  cbtVector3 extends;
  cbtVector3 local_80;
  cbtVector3 local_70;
  cbtVector3 local_60;
  cbtVector3 local_50;
  cbtVector3 local_40;
  
  auVar11 = in_ZMM0._8_56_;
  cVar21 = ::operator+(&this->m_max,&this->m_min);
  auVar4._0_8_ = cVar21.m_floats._0_8_;
  auVar4._8_56_ = auVar11;
  auVar2._8_4_ = 0x3f000000;
  auVar2._0_8_ = 0x3f0000003f000000;
  auVar2._12_4_ = 0x3f000000;
  auVar2 = vmulps_avx512vl(auVar4._0_16_,auVar2);
  auVar18 = (undefined1  [56])0x0;
  local_40.m_floats =
       (cbtScalar  [4])vinsertps_avx(auVar2,ZEXT416((uint)(cVar21.m_floats[2] * 0.5)),0x28);
  auVar11 = ZEXT856(local_40.m_floats._8_8_);
  cVar21 = ::operator-(&this->m_max,&local_40);
  auVar13._0_8_ = cVar21.m_floats._8_8_;
  auVar13._8_56_ = auVar18;
  auVar5._0_8_ = cVar21.m_floats._0_8_;
  auVar5._8_56_ = auVar11;
  local_50.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar5._0_16_,auVar13._0_16_);
  auVar11 = ZEXT856(local_50.m_floats._8_8_);
  cVar21 = cbtTransform::operator()(trans,&local_40);
  auVar14._0_8_ = cVar21.m_floats._8_8_;
  auVar14._8_56_ = auVar18;
  auVar6._0_8_ = cVar21.m_floats._0_8_;
  auVar6._8_56_ = auVar11;
  local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar6._0_16_,auVar14._0_16_);
  auVar11 = ZEXT856(local_40.m_floats._8_8_);
  cVar21 = cbtVector3::absolute((cbtVector3 *)trans);
  auVar15._0_8_ = cVar21.m_floats._8_8_;
  auVar15._8_56_ = auVar18;
  auVar7._0_8_ = cVar21.m_floats._0_8_;
  auVar7._8_56_ = auVar11;
  local_60.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar7._0_16_,auVar15._0_16_);
  auVar11 = ZEXT856(local_60.m_floats._8_8_);
  cVar21 = cbtVector3::absolute((trans->m_basis).m_el + 1);
  auVar16._0_8_ = cVar21.m_floats._8_8_;
  auVar16._8_56_ = auVar18;
  auVar8._0_8_ = cVar21.m_floats._0_8_;
  auVar8._8_56_ = auVar11;
  local_70.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar8._0_16_,auVar16._0_16_);
  auVar11 = ZEXT856(local_70.m_floats._8_8_);
  cVar21 = cbtVector3::absolute((trans->m_basis).m_el + 2);
  auVar17._0_8_ = cVar21.m_floats._8_8_;
  auVar17._8_56_ = auVar18;
  auVar9._0_8_ = cVar21.m_floats._0_8_;
  auVar9._8_56_ = auVar11;
  local_80.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar9._0_16_,auVar17._0_16_);
  auVar11 = ZEXT856(local_80.m_floats._8_8_);
  cVar22 = cbtVector3::dot3(&local_50,&local_60,&local_70,&local_80);
  cVar21.m_floats = local_40.m_floats;
  auVar10._0_8_ = cVar22.m_floats._0_8_;
  auVar10._8_56_ = auVar11;
  auVar19._8_8_ = 0;
  auVar19._0_4_ = local_40.m_floats[0];
  auVar19._4_4_ = local_40.m_floats[1];
  local_40.m_floats[2] = cVar21.m_floats[2];
  auVar2 = vsubps_avx(auVar19,auVar10._0_16_);
  auVar3._20_4_ = cVar22.m_floats[1] + cVar21.m_floats[1];
  auVar3._16_4_ = cVar22.m_floats[0] + cVar21.m_floats[0];
  auVar3._24_4_ = auVar11._0_4_ + 0.0;
  auVar3._28_4_ = auVar11._4_4_ + 0.0;
  auVar3._0_16_ = auVar2;
  auVar12._20_8_ = SUB128(ZEXT812(0),4);
  auVar12._16_4_ = cVar22.m_floats[2] + local_40.m_floats[2];
  auVar20._20_8_ = SUB128(ZEXT812(0),4);
  auVar20._16_4_ = local_40.m_floats[2] - cVar22.m_floats[2];
  auVar12._0_16_ = auVar2;
  auVar12._28_4_ = 0;
  auVar20._0_16_ = auVar2;
  auVar20._28_4_ = 0;
  auVar12 = vperm2f128_avx(auVar20,auVar12,0x31);
  cVar1 = (cbtAABB)vunpcklpd_avx(auVar3,auVar12);
  *this = cVar1;
  return;
}

Assistant:

SIMD_FORCE_INLINE void appy_transform(const cbtTransform &trans)
	{
		cbtVector3 center = (m_max + m_min) * 0.5f;
		cbtVector3 extends = m_max - center;
		// Compute new center
		center = trans(center);

		cbtVector3 textends = extends.dot3(trans.getBasis().getRow(0).absolute(),
										  trans.getBasis().getRow(1).absolute(),
										  trans.getBasis().getRow(2).absolute());

		m_min = center - textends;
		m_max = center + textends;
	}